

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

int incomplete_type_p(c2m_ctx_t c2m_ctx,type *type)

{
  node_t_conflict pnVar1;
  node_t_conflict pnVar2;
  bool bVar3;
  
LAB_0017a45d:
  bVar3 = false;
  switch(type->mode) {
  case TM_BASIC:
    bVar3 = (type->u).basic_type == TP_VOID;
    goto switchD_0017a474_caseD_3;
  case TM_ENUM:
  case TM_STRUCT:
  case TM_UNION:
    pnVar1 = (type->u).tag_type;
    if (((((pnVar1->u).ops.head)->op_link).next)->code != N_IGNORE) {
      pnVar2 = c2m_ctx->check_ctx->curr_scope;
      if (pnVar2 == (node_t_conflict)0x0) goto LAB_0017a4e4;
      goto LAB_0017a4cd;
    }
    break;
  default:
    goto switchD_0017a474_caseD_3;
  case TM_ARR:
    if (((type->u).arr_type)->size->code != N_IGNORE) {
      type = ((type->u).arr_type)->el_type;
      goto LAB_0017a45d;
    }
    break;
  case TM_FUNC:
    type = ((type->u).ptr_type)->arr_type;
    if (type == (type *)0x0) break;
    if ((type->mode != TM_BASIC) || ((type->u).basic_type != TP_VOID)) goto LAB_0017a45d;
    bVar3 = false;
    goto switchD_0017a474_caseD_3;
  }
  bVar3 = true;
  goto switchD_0017a474_caseD_3;
  while (pnVar2 = *(node_t_conflict *)((long)pnVar2->attr + 0x20), pnVar2 != (node_t_conflict)0x0) {
LAB_0017a4cd:
    if ((pnVar2 == pnVar1) || (pnVar2 == c2m_ctx->top_scope)) goto LAB_0017a4e6;
  }
LAB_0017a4e4:
  pnVar2 = (node_t_conflict)0x0;
LAB_0017a4e6:
  bVar3 = pnVar2 == pnVar1;
switchD_0017a474_caseD_3:
  return (int)bVar3;
}

Assistant:

static int incomplete_type_p (c2m_ctx_t c2m_ctx, struct type *type) {
  check_ctx_t check_ctx = c2m_ctx->check_ctx;

  switch (type->mode) {
  case TM_BASIC: return type->u.basic_type == TP_VOID;
  case TM_ENUM:
  case TM_STRUCT:
  case TM_UNION: {
    node_t scope, n = type->u.tag_type;

    if (NL_EL (n->u.ops, 1)->code == N_IGNORE) return TRUE;
    for (scope = curr_scope; scope != NULL && scope != top_scope && scope != n;
         scope = ((struct node_scope *) scope->attr)->scope)
      ;
    return scope == n;
  }
  case TM_PTR: return FALSE;
  case TM_ARR: {
    struct arr_type *arr_type = type->u.arr_type;

    return (arr_type->size->code == N_IGNORE || incomplete_type_p (c2m_ctx, arr_type->el_type));
  }
  case TM_FUNC:
    return ((type = type->u.func_type->ret_type) == NULL
            || (!void_type_p (type) && incomplete_type_p (c2m_ctx, type)));
  default: return FALSE;
  }
}